

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Tee * kj::newTee(Tee *__return_storage_ptr__,Own<kj::AsyncInputStream> *input,uint64_t limit)

{
  uint uVar1;
  Disposer *pDVar2;
  AsyncInputStream *pAVar3;
  PromiseNode *pPVar4;
  AsyncTee *pAVar5;
  long lVar6;
  Refcounted *refcounted;
  Own<kj::(anonymous_namespace)::TeeBranch> OVar7;
  Own<kj::(anonymous_namespace)::AsyncTee> impl;
  Own<kj::(anonymous_namespace)::AsyncTee> local_60;
  Own<kj::(anonymous_namespace)::AsyncTee> local_50;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  int local_2c;
  
  pAVar5 = (AsyncTee *)operator_new(0x278);
  pDVar2 = input->disposer;
  pAVar3 = input->ptr;
  input->ptr = (AsyncInputStream *)0x0;
  (pAVar5->super_Refcounted).refcount = 0;
  (pAVar5->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00468998
  ;
  (pAVar5->inner).disposer = pDVar2;
  (pAVar5->inner).ptr = pAVar3;
  pAVar5->bufferSizeLimit = limit;
  (*pAVar3->_vptr_AsyncInputStream[2])(&pAVar5->length);
  lVar6 = 0x38;
  do {
    *(undefined1 *)((long)pAVar5->branches + lVar6 + -0x38) = 0;
    lVar6 = lVar6 + 0x60;
  } while (lVar6 != 0xf8);
  (pAVar5->stoppage).ptr.isSet = false;
  heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_40);
  pPVar4 = (PromiseNode *)uStack_38;
  uStack_38 = (AsyncInputStream *)0x0;
  (pAVar5->pullPromise).super_PromiseBase.node.disposer = (Disposer *)CONCAT44(uStack_3c,local_40);
  (pAVar5->pullPromise).super_PromiseBase.node.ptr = pPVar4;
  pAVar5->pulling = false;
  uVar1 = (pAVar5->super_Refcounted).refcount;
  (pAVar5->super_Refcounted).refcount = uVar1 + 1;
  (pAVar5->super_Refcounted).refcount = uVar1 + 2;
  local_2c = 0;
  local_60.disposer = (Disposer *)pAVar5;
  local_60.ptr = pAVar5;
  local_50.disposer = (Disposer *)pAVar5;
  local_50.ptr = pAVar5;
  OVar7 = heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
                    ((kj *)&local_40,&local_60,&local_2c);
  pAVar3 = uStack_38;
  pAVar5 = local_60.ptr;
  pDVar2 = (Disposer *)CONCAT44(uStack_3c,local_40);
  uStack_38 = (AsyncInputStream *)0x0;
  if (local_60.ptr != (AsyncTee *)0x0) {
    local_60.ptr = (AsyncTee *)0x0;
    (**(((Refcounted *)&(local_60.disposer)->_vptr_Disposer)->super_Disposer)._vptr_Disposer)
              (local_60.disposer,
               (pAVar5->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)(pAVar5->branches + -1) + 0x28,OVar7.ptr);
  }
  local_60.disposer = (Disposer *)CONCAT44(local_60.disposer._4_4_,1);
  OVar7 = heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
                    ((kj *)&local_40,&local_50,(int *)&local_60);
  pAVar5 = local_50.ptr;
  __return_storage_ptr__->branches[0].disposer = pDVar2;
  __return_storage_ptr__->branches[0].ptr = pAVar3;
  *(undefined4 *)&__return_storage_ptr__->branches[1].disposer = local_40;
  *(undefined4 *)((long)&__return_storage_ptr__->branches[1].disposer + 4) = uStack_3c;
  *(undefined4 *)&__return_storage_ptr__->branches[1].ptr = (undefined4)uStack_38;
  *(undefined4 *)((long)&__return_storage_ptr__->branches[1].ptr + 4) = uStack_38._4_4_;
  if (local_50.ptr != (AsyncTee *)0x0) {
    local_50.ptr = (AsyncTee *)0x0;
    (**(((Refcounted *)&(local_50.disposer)->_vptr_Disposer)->super_Disposer)._vptr_Disposer)
              (local_50.disposer,
               (pAVar5->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)(pAVar5->branches + -1) + 0x28,OVar7.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

Tee newTee(Own<AsyncInputStream> input, uint64_t limit) {
  auto impl = refcounted<AsyncTee>(mv(input), limit);
  Own<AsyncInputStream> branch1 = heap<TeeBranch>(addRef(*impl), 0);
  Own<AsyncInputStream> branch2 = heap<TeeBranch>(mv(impl), 1);
  return { { mv(branch1), mv(branch2) } };
}